

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O3

int64_t hdr_count_at_value(hdr_histogram *h,int64_t value)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  
  uVar3 = h->sub_bucket_mask | value;
  lVar2 = 0x3f;
  if (uVar3 != 0) {
    for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  iVar5 = ((uint)lVar2 ^ 0x3f) + h->sub_bucket_half_count_magnitude + h->unit_magnitude;
  iVar5 = ((0x40 - iVar5 << ((byte)h->sub_bucket_half_count_magnitude & 0x1f)) -
          h->sub_bucket_half_count) +
          (int)(value >> (((char)h->unit_magnitude - (char)iVar5) + 0x3fU & 0x3f));
  if (h->normalizing_index_offset != 0) {
    iVar5 = iVar5 - h->normalizing_index_offset;
    iVar1 = h->counts_len;
    iVar4 = 0;
    if (iVar1 <= iVar5) {
      iVar4 = -iVar1;
    }
    if (iVar5 < 0) {
      iVar4 = iVar1;
    }
    iVar5 = iVar5 + iVar4;
  }
  return h->counts[iVar5];
}

Assistant:

int64_t hdr_count_at_value(const struct hdr_histogram* h, int64_t value)
{
    return counts_get_normalised(h, counts_index_for(h, value));
}